

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbWrite(sqlite3_file *pFile,void *z,int iAmt,sqlite_int64 iOfst)

{
  sqlite3_io_methods *p_00;
  int iVar1;
  int rc;
  MemStore *p;
  sqlite_int64 iOfst_local;
  int iAmt_local;
  void *z_local;
  sqlite3_file *pFile_local;
  
  p_00 = pFile[1].pMethods;
  memdbEnter((MemStore *)p_00);
  if (((ulong)p_00->xSync & 0x400000000) == 0) {
    if (*(long *)p_00 < iOfst + iAmt) {
      if (((long)p_00->xClose < iOfst + iAmt) &&
         (iVar1 = memdbEnlarge((MemStore *)p_00,iOfst + iAmt), iVar1 != 0)) {
        memdbLeave((MemStore *)p_00);
        return iVar1;
      }
      if (*(long *)p_00 < iOfst) {
        memset(p_00->xWrite + *(long *)p_00,0,iOfst - *(long *)p_00);
      }
      *(sqlite_int64 *)p_00 = iOfst + iAmt;
    }
    memcpy(p_00->xWrite + iOfst,z,(long)iAmt);
    memdbLeave((MemStore *)p_00);
    pFile_local._4_4_ = 0;
  }
  else {
    memdbLeave((MemStore *)p_00);
    pFile_local._4_4_ = 0x30a;
  }
  return pFile_local._4_4_;
}

Assistant:

static int memdbWrite(
  sqlite3_file *pFile,
  const void *z,
  int iAmt,
  sqlite_int64 iOfst
){
  MemStore *p = ((MemFile*)pFile)->pStore;
  memdbEnter(p);
  if( NEVER(p->mFlags & SQLITE_DESERIALIZE_READONLY) ){
    /* Can't happen: memdbLock() will return SQLITE_READONLY before
    ** reaching this point */
    memdbLeave(p);
    return SQLITE_IOERR_WRITE;
  }
  if( iOfst+iAmt>p->sz ){
    int rc;
    if( iOfst+iAmt>p->szAlloc
     && (rc = memdbEnlarge(p, iOfst+iAmt))!=SQLITE_OK
    ){
      memdbLeave(p);
      return rc;
    }
    if( iOfst>p->sz ) memset(p->aData+p->sz, 0, iOfst-p->sz);
    p->sz = iOfst+iAmt;
  }
  memcpy(p->aData+iOfst, z, iAmt);
  memdbLeave(p);
  return SQLITE_OK;
}